

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

_pdinstance * pdinstance_init(_pdinstance *x)

{
  t_symbol **pptVar1;
  int local_14;
  int i;
  _pdinstance *x_local;
  
  x->pd_systime = 0.0;
  x->pd_clock_setlist = (_clock *)0x0;
  x->pd_canvaslist = (_glist *)0x0;
  x->pd_templatelist = (_template *)0x0;
  pptVar1 = (t_symbol **)getbytes(0x20000);
  x->pd_symhash = pptVar1;
  for (local_14 = 0; local_14 < 0x4000; local_14 = local_14 + 1) {
    x->pd_symhash[local_14] = (t_symbol *)0x0;
  }
  dogensym("pointer",&s_pointer,x);
  dogensym("float",&s_float,x);
  dogensym("symbol",&s_symbol,x);
  dogensym("bang",&s_bang,x);
  dogensym("list",&s_list,x);
  dogensym("anything",&s_anything,x);
  dogensym("signal",&s_signal,x);
  dogensym("#N",&s__N,x);
  dogensym("#X",&s__X,x);
  dogensym("x",&s_x,x);
  dogensym("y",&s_y,x);
  dogensym("",&s_,x);
  x_midi_newpdinstance();
  g_canvas_newpdinstance();
  d_ugen_newpdinstance();
  s_stuff_newpdinstance();
  return x;
}

Assistant:

static t_pdinstance *pdinstance_init(t_pdinstance *x)
{
    int i;
    x->pd_systime = 0;
    x->pd_clock_setlist = 0;
    x->pd_canvaslist = 0;
    x->pd_templatelist = 0;
    x->pd_symhash = getbytes(SYMTABHASHSIZE * sizeof(*x->pd_symhash));
    for (i = 0; i < SYMTABHASHSIZE; i++)
        x->pd_symhash[i] = 0;
#ifdef PDINSTANCE
    dogensym("pointer",   &x->pd_s_pointer,  x);
    dogensym("float",     &x->pd_s_float,    x);
    dogensym("symbol",    &x->pd_s_symbol,   x);
    dogensym("bang",      &x->pd_s_bang,     x);
    dogensym("list",      &x->pd_s_list,     x);
    dogensym("anything",  &x->pd_s_anything, x);
    dogensym("signal",    &x->pd_s_signal,   x);
    dogensym("#N",        &x->pd_s__N,       x);
    dogensym("#X",        &x->pd_s__X,       x);
    dogensym("x",         &x->pd_s_x,        x);
    dogensym("y",         &x->pd_s_y,        x);
    dogensym("",          &x->pd_s_,         x);
    pd_this = x;
#else
    dogensym("pointer",   &s_pointer,  x);
    dogensym("float",     &s_float,    x);
    dogensym("symbol",    &s_symbol,   x);
    dogensym("bang",      &s_bang,     x);
    dogensym("list",      &s_list,     x);
    dogensym("anything",  &s_anything, x);
    dogensym("signal",    &s_signal,   x);
    dogensym("#N",        &s__N,       x);
    dogensym("#X",        &s__X,       x);
    dogensym("x",         &s_x,        x);
    dogensym("y",         &s_y,        x);
    dogensym("",          &s_,         x);
#endif
    x_midi_newpdinstance();
    g_canvas_newpdinstance();
    d_ugen_newpdinstance();
    s_stuff_newpdinstance();
    return (x);
}